

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O0

void cfd::core::logger::log<double&,long&,long&,long&>
               (CfdSourceLocation *source,CfdLogLevel lvl,char *fmt,double *args,long *args_1,
               long *args_2,long *args_3)

{
  bool bVar1;
  CfdLogLevel in_ESI;
  CfdSourceLocation *in_RDI;
  string_view format_str;
  format_args args_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_double,_long,_long,_long>
  *vargs;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *args_3_00;
  string *__return_storage_ptr__;
  remove_reference_t<long_&> *in_stack_fffffffffffffed8;
  remove_reference_t<double_&> *in_stack_fffffffffffffee0;
  char **in_stack_fffffffffffffee8;
  undefined8 local_e0;
  CfdLogLevel local_d4;
  CfdSourceLocation *local_d0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_c8;
  basic_string_view<char> local_b8;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> local_a8 [4];
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_60;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_58;
  undefined8 *local_38;
  string *local_30;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_20;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_18;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_10;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_8;
  
  local_d4 = in_ESI;
  local_d0 = in_RDI;
  bVar1 = IsEnableLogLevel(in_ESI);
  if (bVar1) {
    __return_storage_ptr__ = (string *)&stack0xfffffffffffffee8;
    local_38 = &local_e0;
    local_58.values_ = in_stack_00000008.values_;
    args_3_00 = local_a8;
    local_30 = __return_storage_ptr__;
    ::fmt::v7::make_args_checked<double&,long&,long&,long&,char_const*,char>
              (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
               (remove_reference_t<long_&> *)__return_storage_ptr__,
               (remove_reference_t<long_&> *)args_3_00);
    local_60 = args_3_00;
    local_b8 = ::fmt::v7::to_string_view<char,_0>((char *)*local_38);
    local_20 = &local_c8;
    local_28 = local_60;
    local_18 = local_60;
    local_8 = local_60;
    local_10 = local_20;
    ::fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_20,0x333a,local_60);
    format_str.size_ = local_c8.desc_;
    format_str.data_ = (char *)local_b8.size_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_stack_00000008.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_c8.field_1.values_;
    ::fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)local_b8.data_,format_str,args_00);
    WriteLog(local_d0,local_d4,__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt, Args &&...args) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    auto message = fmt::format(fmt, args...);
    // std::string message = fmt::format(std::locale::messages, fmt, args...);
    cfd::core::logger::WriteLog(source, lvl, message);
  }
}